

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Data>
          (PointerBuilder *this,void *defaultValue,ByteCount defaultSize)

{
  CapTableBuilder *capTable;
  word *pwVar1;
  BuilderArena *this_00;
  uint uVar2;
  SegmentBuilder *this_01;
  ulong uVar3;
  WirePointer *pWVar4;
  uint uVar5;
  word *result;
  WirePointer *__dest;
  WirePointer *ref;
  AllocateResult AVar6;
  Builder BVar7;
  Fault f;
  ThrowOverflow local_41;
  void *local_40;
  Fault local_38;
  
  ref = this->pointer;
  this_01 = this->segment;
  capTable = this->capTable;
  uVar2 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_41);
  uVar5 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar5 != 0) {
    local_40 = defaultValue;
    if ((uVar5 & 3) == 2) {
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar5 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar3 = (ulong)(uVar5 & 0xfffffff8);
      pWVar4 = (WirePointer *)((long)&pwVar1->content + uVar3);
      ref = (WirePointer *)((long)&pwVar1[1].content + uVar3);
      if ((uVar5 & 4) == 0) {
        __dest = ref + ((int)(pWVar4->offsetAndKind).value >> 2);
        ref = pWVar4;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(pWVar4->field_1).structRef);
        __dest = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar4->offsetAndKind).value & 0xfffffff8));
      }
    }
    else {
      __dest = ref + (long)((int)uVar5 >> 2) + 1;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    if (((ref->offsetAndKind).value & 3) == 1) {
      if (((ref->field_1).upper32Bits & 7) == 2) {
        uVar3 = (ulong)((ref->field_1).upper32Bits >> 3);
        goto LAB_0015b1dc;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[77]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6c3,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                 "\"Called getData{Field,Element}() but existing list pointer is not byte-sized.\"",
                 (char (*) [77])
                 "Called getData{Field,Element}() but existing list pointer is not byte-sized.");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6bf,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Called getData{Field,Element}() but existing pointer is not a list.\"",
                 (char (*) [68])
                 "Called getData{Field,Element}() but existing pointer is not a list.");
    }
    kj::_::Debug::Fault::~Fault(&local_38);
    defaultValue = local_40;
  }
  if (uVar2 == 0) {
    uVar3 = 0;
    __dest = (WirePointer *)0x0;
  }
  else {
    uVar5 = uVar2 + 7 >> 3;
    local_40 = defaultValue;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,capTable,ref);
    }
    __dest = (WirePointer *)this_01->pos;
    if (((long)((long)(this_01->super_SegmentReader).ptr.ptr +
               ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
         (long)(ulong)uVar5) ||
       (this_01->pos = (word *)(__dest + uVar5), __dest == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      uVar5 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar5 + 1,(anon_class_1_0_00000001 *)&local_38);
      AVar6 = BuilderArena::allocate(this_00,uVar5);
      pWVar4 = (WirePointer *)AVar6.words;
      (ref->offsetAndKind).value =
           (int)AVar6.words - *(int *)&((AVar6.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar6.segment)->super_SegmentReader).id.value;
      (pWVar4->offsetAndKind).value = 1;
      __dest = pWVar4 + 1;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)__dest - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar4 = ref;
    }
    (pWVar4->field_1).upper32Bits = uVar2 * 8 + 2;
    uVar3 = (ulong)uVar2;
    memcpy(__dest,local_40,uVar3);
  }
LAB_0015b1dc:
  BVar7.super_ArrayPtr<unsigned_char>.size_ = uVar3;
  BVar7.super_ArrayPtr<unsigned_char>.ptr = (uchar *)__dest;
  return (Builder)BVar7.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder PointerBuilder::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableDataPointer(pointer, segment, capTable, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}